

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateYield(ExpressionTranslateContext *ctx,ExprYield *expression)

{
  ExprBase *expression_00;
  ExprBase *pEVar1;
  char *format;
  bool bVar2;
  
  if (expression->coroutineStateUpdate != (ExprBase *)0x0) {
    Translate(ctx,expression->coroutineStateUpdate);
    Print(ctx,";");
    OutputContext::Print(ctx->output,"\n",1);
    PrintIndent(ctx);
  }
  expression_00 = expression->closures;
  if ((expression_00 == (ExprBase *)0x0) || (pEVar1 = expression_00, expression_00->typeID != 0x37))
  {
    pEVar1 = (ExprBase *)0x0;
  }
  if (pEVar1 == (ExprBase *)0x0) {
    bVar2 = true;
  }
  else {
    bVar2 = pEVar1[1].typeID == 0;
  }
  if (expression->value->type == ctx->ctx->typeVoid) {
    if (!bVar2) {
      Translate(ctx,expression_00);
      Print(ctx,";");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
    }
    Translate(ctx,expression->value);
    Print(ctx,";");
    OutputContext::Print(ctx->output,"\n",1);
    PrintIndent(ctx);
    format = "return;";
  }
  else {
    if (!bVar2) {
      Print(ctx,"__nullcReturnValue_%d = ",(ulong)ctx->nextReturnValueId);
      Translate(ctx,expression->value);
      Print(ctx,";");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      Translate(ctx,expression->closures);
      Print(ctx,";");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      Print(ctx,"return __nullcReturnValue_%d;",(ulong)ctx->nextReturnValueId);
      goto LAB_00145347;
    }
    Print(ctx,"return ");
    Translate(ctx,expression->value);
    format = ";";
  }
  Print(ctx,format);
LAB_00145347:
  OutputContext::Print(ctx->output,"\n",1);
  ctx->currentFunction->nextTranslateRestoreBlock =
       ctx->currentFunction->nextTranslateRestoreBlock + 1;
  Print(ctx,"yield_%d:");
  return;
}

Assistant:

void TranslateYield(ExpressionTranslateContext &ctx, ExprYield *expression)
{
	if(expression->coroutineStateUpdate)
	{
		Translate(ctx, expression->coroutineStateUpdate);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);
	}

	ExprSequence *closures = getType<ExprSequence>(expression->closures);

	if(closures && closures->expressions.empty())
		closures = NULL;

	if(expression->value->type == ctx.ctx.typeVoid)
	{
		if(closures)
		{
			Translate(ctx, expression->closures);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);
		}

		Translate(ctx, expression->value);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);

		Print(ctx, "return;");
	}
	else if(closures)
	{
		Print(ctx, "__nullcReturnValue_%d = ", ctx.nextReturnValueId);
		Translate(ctx, expression->value);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);

		Translate(ctx, expression->closures);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);

		Print(ctx, "return __nullcReturnValue_%d;", ctx.nextReturnValueId);
	}
	else
	{
		Print(ctx, "return ");
		Translate(ctx, expression->value);
		Print(ctx, ";");
	}

	PrintLine(ctx);

	Print(ctx, "yield_%d:", ctx.currentFunction->nextTranslateRestoreBlock++);
}